

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O2

int VmIntPow(int power,int number)

{
  int iVar1;
  int iVar2;
  
  if (power < 0) {
    if (number == 1) {
      return 1;
    }
    if (number == -1) {
      return -(power & 1U) | 1;
    }
    iVar1 = 0;
  }
  else {
    iVar1 = 1;
    for (; power != 0; power = (uint)power >> 1) {
      iVar2 = 1;
      if ((power & 1U) != 0) {
        iVar2 = number;
      }
      iVar1 = iVar1 * iVar2;
      number = number * number;
    }
  }
  return iVar1;
}

Assistant:

int VmIntPow(int power, int number)
{
	if(power < 0)
		return number == 1 ? 1 : (number == -1 ? ((power & 1) ? -1 : 1) : 0);

	int result = 1;
	while(power)
	{
		if(power & 1)
		{
			result *= number;
			power--;
		}
		number *= number;
		power >>= 1;
	}
	return result;
}